

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Gluco::Heap<Gluco::Solver::VarOrderLt>::decrease(Heap<Gluco::Solver::VarOrderLt> *this,int n)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  if (((this->indices).sz <= n) || (iVar8 = (this->indices).data[n], iVar8 < 0)) {
    __assert_fail("inHeap(n)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Heap.h"
                  ,0x56,
                  "void Gluco::Heap<Gluco::Solver::VarOrderLt>::decrease(int) [Comp = Gluco::Solver::VarOrderLt]"
                 );
  }
  piVar4 = (this->heap).data;
  iVar3 = piVar4[iVar8];
  if (iVar8 == 0) {
    piVar7 = (this->indices).data;
    piVar6 = piVar4;
    iVar8 = 0;
  }
  else {
    piVar7 = (this->indices).data;
    pdVar5 = ((this->lt).activity)->data;
    dVar2 = pdVar5[iVar3];
    do {
      uVar10 = iVar8 - 1;
      iVar9 = (int)uVar10 >> 1;
      pdVar1 = pdVar5 + piVar4[iVar9];
      piVar6 = piVar4 + iVar8;
      if (dVar2 < *pdVar1 || dVar2 == *pdVar1) break;
      piVar4[iVar8] = piVar4[iVar9];
      piVar7[piVar4[iVar9]] = iVar8;
      piVar6 = piVar4;
      iVar8 = iVar9;
    } while (1 < uVar10);
  }
  *piVar6 = iVar3;
  piVar7[iVar3] = iVar8;
  return;
}

Assistant:

bool inHeap    (int n)     const { return n < indices.size() && indices[n] >= 0; }